

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmMakefile.cxx
# Opt level: O3

void s_AddDefineFlag(string *flag,string *dflags)

{
  char *pcVar1;
  size_type sVar2;
  pointer pcVar3;
  size_type sVar4;
  
  sVar4 = dflags->_M_string_length;
  std::__cxx11::string::push_back((char)dflags);
  std::__cxx11::string::_M_append((char *)dflags,(ulong)(flag->_M_dataplus)._M_p);
  pcVar3 = (dflags->_M_dataplus)._M_p;
  sVar2 = dflags->_M_string_length;
  pcVar1 = pcVar3 + sVar4 + 1;
  if (pcVar1 != pcVar3 + sVar2) {
    sVar4 = sVar4 + 1;
    do {
      if (pcVar3[sVar4] == '\n') {
        pcVar3[sVar4] = ' ';
      }
      sVar4 = sVar4 + 1;
    } while (sVar2 != sVar4);
    pcVar3 = (dflags->_M_dataplus)._M_p;
    sVar2 = dflags->_M_string_length;
  }
  for (; pcVar1 != pcVar3 + sVar2; pcVar1 = pcVar1 + 1) {
    if (*pcVar1 == '\r') {
      *pcVar1 = ' ';
    }
  }
  return;
}

Assistant:

static void s_AddDefineFlag(std::string const& flag, std::string& dflags)
{
  // remove any \n\r
  std::string::size_type initSize = dflags.size();
  dflags += ' ';
  dflags += flag;
  std::string::iterator flagStart = dflags.begin() + initSize + 1;
  std::replace(flagStart, dflags.end(), '\n', ' ');
  std::replace(flagStart, dflags.end(), '\r', ' ');
}